

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void disas_from_mext(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 pTVar1;
  TCGv_i32 *ppTVar2;
  code *func;
  TCGTemp *local_28;
  TCGv_i32 local_20;
  
  tcg_ctx = s->uc->tcg_ctx;
  if ((insn & 8) == 0) {
    ppTVar2 = tcg_ctx->cpu_dregs;
  }
  else {
    ppTVar2 = s->writeback;
    if (((uint)s->writeback_mask >> (insn & 7) & 1) == 0) {
      ppTVar2 = tcg_ctx->cpu_aregs;
    }
  }
  pTVar1 = ppTVar2[insn & 7];
  local_20 = tcg_const_i32_m68k(tcg_ctx,insn >> 9 & 2);
  local_28 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  local_20 = local_20 + (long)tcg_ctx;
  if ((s->env->macsr & 0x20) == 0) {
    func = helper_get_mac_exti_m68k;
  }
  else {
    func = helper_get_mac_extf_m68k;
  }
  tcg_gen_callN_m68k(tcg_ctx,func,(TCGTemp *)(pTVar1 + (long)tcg_ctx),2,&local_28);
  return;
}

Assistant:

DISAS_INSN(from_mext)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv reg;
    TCGv acc;
    reg = (insn & 8) ? AREG(insn, 0) : DREG(insn, 0);
    acc = tcg_const_i32(tcg_ctx, (insn & 0x400) ? 2 : 0);
    if (s->env->macsr & MACSR_FI)
        gen_helper_get_mac_extf(tcg_ctx, reg, tcg_ctx->cpu_env, acc);
    else
        gen_helper_get_mac_exti(tcg_ctx, reg, tcg_ctx->cpu_env, acc);
}